

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoull.c
# Opt level: O2

ulonglong strtoull(char *__nptr,char **__endptr,int __base)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  char sign;
  char *p;
  int base_local;
  
  sign = '+';
  base_local = __base;
  p = _PDCLIB_strtox_prelim(__nptr,&sign,&base_local);
  if (base_local - 0x25U < 0xffffffdd) {
    uVar2 = 0;
  }
  else {
    uVar1 = _PDCLIB_strtox_main(&p,base_local,0xffffffffffffffff,
                                0xffffffffffffffff / (ulong)(uint)base_local,
                                (int)(0xffffffffffffffff % (ulong)(uint)base_local),&sign);
    if (__endptr != (char **)0x0) {
      if (p != (char *)0x0) {
        __nptr = p;
      }
      *__endptr = __nptr;
    }
    uVar2 = -uVar1;
    if (sign == '+') {
      uVar2 = uVar1;
    }
  }
  return uVar2;
}

Assistant:

unsigned long long int strtoull( const char * s, char ** endptr, int base )
{
    unsigned long long int rc;
    char sign = '+';
    const char * p = _PDCLIB_strtox_prelim( s, &sign, &base );

    if ( base < 2 || base > 36 )
    {
        return 0;
    }

    rc = _PDCLIB_strtox_main( &p, ( unsigned )base, ( uintmax_t )ULLONG_MAX, ( uintmax_t )( ULLONG_MAX / base ), ( int )( ULLONG_MAX % base ), &sign );

    if ( endptr != NULL )
    {
        *endptr = ( p != NULL ) ? ( char * ) p : ( char * ) s;
    }

    return ( sign == '+' ) ? rc : -rc;
}